

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::TeamCityReporter::testGroupStarting(TeamCityReporter *this,GroupInfo *groupInfo)

{
  ostream *poVar1;
  string sStack_38;
  
  LazyStat<Catch::GroupInfo>::operator=
            (&(this->super_StreamingReporterBase).currentGroupInfo,groupInfo);
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           "##teamcity[testSuiteStarted name=\'");
  anon_unknown_23::escape(&sStack_38,&groupInfo->name);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_38);
  std::operator<<(poVar1,"\']\n");
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void TeamCityReporter::testGroupStarting(GroupInfo const &groupInfo) {
        StreamingReporterBase::testGroupStarting(groupInfo);
        stream << "##teamcity[testSuiteStarted name='"
            << escape(groupInfo.name) << "']\n";
    }